

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter.cpp
# Opt level: O2

void __thiscall Assimp::X3DImporter::ParseNode_Head(X3DImporter *this)

{
  FIReader *pFVar1;
  bool bVar2;
  int iVar3;
  CX3DImporter_NodeElement_MetaString *this_00;
  undefined4 extraout_var;
  undefined8 extraout_RAX;
  X3DImporter *this_01;
  allocator<char> local_51;
  _Alloc_hider local_50;
  
LAB_0053babc:
  do {
    do {
      while( true ) {
        iVar3 = (*(((this->mReader)._M_t.
                    super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                    .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                  super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[2])();
        if ((char)iVar3 == '\0') {
          this_01 = (X3DImporter *)&stack0xffffffffffffffb0;
          std::__cxx11::string::string<std::allocator<char>>((string *)this_01,"head",&local_51);
          Throw_CloseNotFound(this_01,(string *)&stack0xffffffffffffffb0);
          std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
          _Unwind_Resume(extraout_RAX);
        }
        iVar3 = (*(((this->mReader)._M_t.
                    super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                    .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                  super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[3])();
        if (iVar3 == 1) break;
        iVar3 = (*(((this->mReader)._M_t.
                    super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                    .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                  super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[3])();
        if (iVar3 == 2) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&stack0xffffffffffffffb0,"head",&local_51);
          bVar2 = XML_CheckNode_NameEqual(this,(value_type *)&stack0xffffffffffffffb0);
          std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
          if (bVar2) {
            return;
          }
        }
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&stack0xffffffffffffffb0,"meta",&local_51);
      bVar2 = XML_CheckNode_NameEqual(this,(value_type *)&stack0xffffffffffffffb0);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
    } while (!bVar2);
    XML_CheckNode_MustBeEmpty(this);
    this_00 = (CX3DImporter_NodeElement_MetaString *)operator_new(0xa8);
    CX3DImporter_NodeElement_MetaString::CX3DImporter_NodeElement_MetaString
              (this_00,this->NodeElement_Cur);
    pFVar1 = (this->mReader)._M_t.
             super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
             super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
             super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl;
    (*(pFVar1->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[8])(pFVar1,"name");
    std::__cxx11::string::assign((char *)&(this_00->super_CX3DImporter_NodeElement_Meta).Name);
    if ((this_00->super_CX3DImporter_NodeElement_Meta).Name._M_string_length != 0) {
      pFVar1 = (this->mReader)._M_t.
               super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
               super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
               super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl;
      iVar3 = (*(pFVar1->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[8])
                        (pFVar1,"content");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&stack0xffffffffffffffb0,(char *)CONCAT44(extraout_var,iVar3),&local_51);
      std::__cxx11::
      list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this_00->Value,(value_type *)&stack0xffffffffffffffb0);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
      local_50._M_p = (pointer)this_00;
      std::__cxx11::list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::
      push_back(&this->NodeElement_List,(value_type *)&stack0xffffffffffffffb0);
      if (this->NodeElement_Cur != (CX3DImporter_NodeElement *)0x0) {
        local_50._M_p = (pointer)this_00;
        std::__cxx11::list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
        ::push_back(&this->NodeElement_Cur->Child,(value_type *)&stack0xffffffffffffffb0);
        goto LAB_0053babc;
      }
    }
    (*(this_00->super_CX3DImporter_NodeElement_Meta).super_CX3DImporter_NodeElement.
      _vptr_CX3DImporter_NodeElement[1])(this_00);
  } while( true );
}

Assistant:

void X3DImporter::ParseNode_Head()
{
    bool close_found = false;// flag: true if close tag of node are found.

	while(mReader->read())
	{
		if(mReader->getNodeType() == irr::io::EXN_ELEMENT)
		{
			if(XML_CheckNode_NameEqual("meta"))
			{
				XML_CheckNode_MustBeEmpty();

				// adding metadata from <head> as MetaString from <Scene>
                bool added( false );
                CX3DImporter_NodeElement_MetaString* ms = new CX3DImporter_NodeElement_MetaString(NodeElement_Cur);

				ms->Name = mReader->getAttributeValueSafe("name");
				// name must not be empty
				if(!ms->Name.empty())
				{
					ms->Value.push_back(mReader->getAttributeValueSafe("content"));
					NodeElement_List.push_back(ms);
                    if ( NodeElement_Cur != nullptr )
                    {
                        NodeElement_Cur->Child.push_back( ms );
                        added = true;
                    }
				}
                // if an error has occurred, release instance
                if ( !added ) {
                    delete ms;
                }
			}// if(XML_CheckNode_NameEqual("meta"))
		}// if(mReader->getNodeType() == irr::io::EXN_ELEMENT)
		else if(mReader->getNodeType() == irr::io::EXN_ELEMENT_END)
		{
			if(XML_CheckNode_NameEqual("head"))
			{
				close_found = true;
				break;
			}
		}// if(mReader->getNodeType() == irr::io::EXN_ELEMENT) else
	}// while(mReader->read())

    if ( !close_found )
    {
        Throw_CloseNotFound( "head" );
    }
}